

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.h
# Opt level: O1

int __thiscall axl::io::SimpleMappedFile::close(SimpleMappedFile *this,int __fd)

{
  int iVar1;
  
  iVar1 = (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
          m_h;
  if (iVar1 != -1) {
    ::close(iVar1);
    (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
         -1;
  }
  iVar1 = Mapping::close(&this->m_mapping,__fd);
  this->m_openFlags = 0;
  return iVar1;
}

Assistant:

void
	close() {
		m_file.close();
		m_mapping.close();
		m_openFlags = 0;
	}